

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O1

void __thiscall cmOutputConverter::ComputeRelativePathTopRelation(cmOutputConverter *this)

{
  string *c1;
  string *c2;
  bool bVar1;
  
  c1 = &this->RelativePathTopSource;
  c2 = &this->RelativePathTopBinary;
  bVar1 = cmsys::SystemTools::ComparePath(c1,c2);
  if (bVar1) {
    this->RelativePathTopRelation = InSource;
  }
  else {
    bVar1 = cmsys::SystemTools::IsSubDirectory(c2,c1);
    if (bVar1) {
      this->RelativePathTopRelation = BinInSrc;
    }
    else {
      bVar1 = cmsys::SystemTools::IsSubDirectory(c1,c2);
      if (bVar1) {
        this->RelativePathTopRelation = SrcInBin;
      }
      else {
        this->RelativePathTopRelation = Separate;
      }
    }
  }
  return;
}

Assistant:

void cmOutputConverter::ComputeRelativePathTopRelation()
{
  if (cmSystemTools::ComparePath(this->RelativePathTopSource,
                                 this->RelativePathTopBinary)) {
    this->RelativePathTopRelation = TopRelation::InSource;
  } else if (cmSystemTools::IsSubDirectory(this->RelativePathTopBinary,
                                           this->RelativePathTopSource)) {
    this->RelativePathTopRelation = TopRelation::BinInSrc;
  } else if (cmSystemTools::IsSubDirectory(this->RelativePathTopSource,
                                           this->RelativePathTopBinary)) {
    this->RelativePathTopRelation = TopRelation::SrcInBin;
  } else {
    this->RelativePathTopRelation = TopRelation::Separate;
  }
}